

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestXmlElementHandler.cpp
# Opt level: O3

void __thiscall
TestXmlElementHandler::endHeader(TestXmlElementHandler *this,Header *header,QDomElement *xmlElement)

{
  int iVar1;
  undefined8 extraout_RAX;
  QChar *pQVar2;
  QByteArrayView QVar3;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  char *local_38;
  QByteArrayView local_30;
  
  QDomElement::tagName();
  pQVar2 = (QChar *)local_58.ptr;
  if ((QChar *)local_58.ptr == (QChar *)0x0) {
    pQVar2 = (QChar *)&QString::_empty;
  }
  iVar1 = QString::compare_helper(pQVar2,local_58.size,"header",-1,CaseSensitive);
  if (iVar1 == 0) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    local_38 = "endHeader";
    QByteArrayView::QByteArrayView<const_char_*,_true>(&local_30,&local_38);
    QVar3.m_data = (storage_type *)local_30.m_size;
    QVar3.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar3);
    local_78.ptr = local_58.ptr;
    local_78.d = local_58.d;
    local_58.d = (Data *)0x0;
    local_58.ptr = (char16_t *)0x0;
    local_78.size = local_58.size;
    local_58.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&this->cb,(this->cb).d.size,(QString *)&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    return;
  }
  endHeader();
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void TestXmlElementHandler::endHeader(KDReports::Header &header, const QDomElement &xmlElement)
{
    Q_UNUSED(header);
    Q_UNUSED(xmlElement); // unused in release mode
    Q_ASSERT(xmlElement.tagName() == "header");
    cb << "endHeader";
}